

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

SharedPtr __thiscall
deqp::gles31::Functional::anon_unknown_0::generateRandomVariableDefinition
          (anon_unknown_0 *this,Random *rnd,SharedPtr *parentStructure,DataType baseType,
          Layout *layout,bool allowUnsized)

{
  bool bVar1;
  ArrayElement *pAVar2;
  Node *ptr;
  Variable *this_00;
  SharedPtrStateBase *extraout_RDX;
  float fVar3;
  SharedPtr SVar4;
  byte local_91;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
  local_90;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
  local_80;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
  local_70;
  int local_60;
  int nestNdx;
  byte local_49;
  undefined1 local_48 [7];
  bool canBeInsideAStruct;
  SharedPtr currentStructure;
  int maxNesting;
  bool allowUnsized_local;
  Layout *layout_local;
  DataType baseType_local;
  SharedPtr *parentStructure_local;
  Random *rnd_local;
  
  currentStructure.m_state._0_4_ = 4;
  currentStructure.m_state._7_1_ = allowUnsized;
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_48,parentStructure);
  local_91 = 0;
  if (layout->binding == -1) {
    bVar1 = isDataTypeLayoutQualified(baseType);
    local_91 = bVar1 ^ 0xff;
  }
  local_49 = local_91 & 1;
  for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
    if ((((currentStructure.m_state._7_1_ & 1) == 0) || (local_60 != 0)) ||
       (fVar3 = de::Random::getFloat(rnd), 0.2 <= fVar3)) {
      fVar3 = de::Random::getFloat(rnd);
      if ((0.3 <= fVar3) || ((local_49 & 1) == 0)) {
        fVar3 = de::Random::getFloat(rnd);
        if (0.3 <= fVar3) break;
        pAVar2 = (ArrayElement *)operator_new(0x28);
        ResourceDefinition::ArrayElement::ArrayElement(pAVar2,(SharedPtr *)local_48,-1);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&local_90,(Node *)pAVar2);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        operator=((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)local_48,&local_90);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr(&local_90);
      }
      else {
        ptr = (Node *)operator_new(0x20);
        ResourceDefinition::StructMember::StructMember((StructMember *)ptr,(SharedPtr *)local_48);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&local_80,ptr);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        operator=((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)local_48,&local_80);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr(&local_80);
      }
    }
    else {
      pAVar2 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar2,(SharedPtr *)local_48,-2);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&local_70,(Node *)pAVar2);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::operator=((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)local_48,&local_70);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&local_70);
    }
  }
  this_00 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(this_00,(SharedPtr *)local_48,baseType);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)this,(Node *)this_00);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_48);
  SVar4.m_state = extraout_RDX;
  SVar4.m_ptr = (Node *)this;
  return SVar4;
}

Assistant:

static ResourceDefinition::Node::SharedPtr generateRandomVariableDefinition (de::Random&								rnd,
																			 const ResourceDefinition::Node::SharedPtr&	parentStructure,
																			 glu::DataType								baseType,
																			 const glu::Layout&							layout,
																			 bool										allowUnsized)
{
	const int							maxNesting			= 4;
	ResourceDefinition::Node::SharedPtr	currentStructure	= parentStructure;
	const bool							canBeInsideAStruct	= layout.binding == -1 && !isDataTypeLayoutQualified(baseType);

	for (int nestNdx = 0; nestNdx < maxNesting; ++nestNdx)
	{
		if (allowUnsized && nestNdx == 0 && rnd.getFloat() < 0.2)
			currentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::ArrayElement(currentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		else if (rnd.getFloat() < 0.3 && canBeInsideAStruct)
			currentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StructMember(currentStructure));
		else if (rnd.getFloat() < 0.3)
			currentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::ArrayElement(currentStructure));
		else
			break;
	}

	return ResourceDefinition::Node::SharedPtr(new ResourceDefinition::Variable(currentStructure, baseType));
}